

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cc
# Opt level: O2

void __thiscall avro::Name::check(Name *this)

{
  size_type sVar1;
  char *pcVar2;
  pointer pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  Exception *pEVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  sVar1 = (this->ns_)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->ns_)._M_dataplus._M_p;
    if ((*pcVar2 != '.') && (pcVar2[sVar1 - 1] != '.')) {
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<bool(*)(char)>>
                        (pcVar2,pcVar2 + sVar1,invalidChar1);
      if (_Var4._M_current == (this->ns_)._M_dataplus._M_p + (this->ns_)._M_string_length)
      goto LAB_0015cb62;
    }
    pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
    std::operator+(&bStack_38,"Invalid namespace: ",&this->ns_);
    Exception::Exception(pEVar5,&bStack_38);
    __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
  }
LAB_0015cb62:
  sVar1 = (this->simpleName_)._M_string_length;
  if (sVar1 != 0) {
    pcVar3 = (this->simpleName_)._M_dataplus._M_p;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<bool(*)(char)>>
                      (pcVar3,pcVar3 + sVar1,invalidChar2);
    if (_Var4._M_current ==
        (this->simpleName_)._M_dataplus._M_p + (this->simpleName_)._M_string_length) {
      return;
    }
  }
  pEVar5 = (Exception *)__cxa_allocate_exception(0x18);
  std::operator+(&bStack_38,"Invalid name: ",&this->simpleName_);
  Exception::Exception(pEVar5,&bStack_38);
  __cxa_throw(pEVar5,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Name::check() const
{
    if (! ns_.empty() && (ns_[0] == '.' || ns_[ns_.size() - 1] == '.' || std::find_if(ns_.begin(), ns_.end(), invalidChar1) != ns_.end())) {
        throw Exception("Invalid namespace: " + ns_);
    }
    if (simpleName_.empty() || std::find_if(simpleName_.begin(), simpleName_.end(), invalidChar2) != simpleName_.end()) {
        throw Exception("Invalid name: " + simpleName_);
    }
}